

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squtils.h
# Opt level: O0

void __thiscall
sqvector<SQObjectPtr>::resize
          (sqvector<SQObjectPtr> *this,SQUnsignedInteger newsize,SQObjectPtr *fill)

{
  SQObjectPtr *in_RDX;
  sqvector<SQObjectPtr> *in_RSI;
  long *in_RDI;
  SQUnsignedInteger i;
  sqvector<SQObjectPtr> *psVar1;
  
  if ((sqvector<SQObjectPtr> *)in_RDI[2] < in_RSI) {
    _realloc(in_RSI,(SQUnsignedInteger)in_RDX);
  }
  psVar1 = in_RSI;
  if ((sqvector<SQObjectPtr> *)in_RDI[1] < in_RSI) {
    while ((sqvector<SQObjectPtr> *)in_RDI[1] < in_RSI) {
      ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)(*in_RDI + in_RDI[1] * 0x10),in_RDX);
      in_RDI[1] = in_RDI[1] + 1;
    }
  }
  else {
    for (; in_RSI < (sqvector<SQObjectPtr> *)in_RDI[1];
        in_RSI = (sqvector<SQObjectPtr> *)((long)&in_RSI->_vals + 1)) {
      ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_RSI);
    }
    in_RDI[1] = (long)psVar1;
  }
  return;
}

Assistant:

void resize(SQUnsignedInteger newsize, const T& fill = T())
    {
        if(newsize > _allocated)
            _realloc(newsize);
        if(newsize > _size) {
            while(_size < newsize) {
                new ((void *)&_vals[_size]) T(fill);
                _size++;
            }
        }
        else{
            for(SQUnsignedInteger i = newsize; i < _size; i++) {
                _vals[i].~T();
            }
            _size = newsize;
        }
    }